

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

void __thiscall RenX::Server::banPlayer(Server *this,int id,string_view banner,string_view reason)

{
  undefined4 uVar1;
  size_type sVar2;
  char *pcVar3;
  PlayerInfo *player_00;
  duration<long,_std::ratio<1L,_1L>_> length;
  string_view str;
  PlayerInfo *player;
  string local_98;
  __sv_type local_78;
  RenX *local_68;
  char *pcStack_60;
  undefined1 local_58 [8];
  string out_reason;
  int id_local;
  Server *this_local;
  string_view reason_local;
  string_view banner_local;
  
  pcStack_60 = reason._M_str;
  local_68 = (RenX *)reason._M_len;
  str._M_str = banner._M_str;
  out_reason.field_2._12_4_ = id;
  if ((this->m_rconBan & 1U) == 0) {
    player_00 = getPlayer(this,id);
    if (player_00 != (PlayerInfo *)0x0) {
      length = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
      banPlayer(this,player_00,banner,reason,(seconds)length.__r);
    }
  }
  else {
    str._M_len = (size_t)pcStack_60;
    escapifyRCON_abi_cxx11_((string *)local_58,local_68,str);
    uVar1 = out_reason.field_2._12_4_;
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((string *)local_58);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((string *)local_58);
    string_printf_abi_cxx11_(&local_98,"ckickban pid%d %.*s\n",(ulong)(uint)uVar1,sVar2,pcVar3);
    local_78 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
    sendSocket(this,local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void RenX::Server::banPlayer(int id, std::string_view banner, std::string_view reason) {
	if (m_rconBan) {
		std::string out_reason = RenX::escapifyRCON(reason);
		sendSocket(string_printf("ckickban pid%d %.*s\n", id, out_reason.size(), out_reason.data()));
	}
	else {
		RenX::PlayerInfo *player = getPlayer(id);
		if (player != nullptr) {
			banPlayer(*player, banner, reason);
		}
	}
}